

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  float **ppfVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  double *pdVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  float *pfVar25;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM2_Qb;
  
  if (0 < partitionCount) {
    piVar12 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
    ppfVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials;
    ppfVar14 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights;
    pfVar15 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    uVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    iVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    iVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    uVar20 = 0;
    do {
      iVar9 = piVar12[partitionIndices[uVar20]];
      iVar10 = piVar12[(long)partitionIndices[uVar20] + 1];
      pfVar25 = ppfVar13[bufferIndices[uVar20]];
      pfVar16 = ppfVar14[categoryWeightsIndices[uVar20]];
      iVar11 = iVar9 * 4;
      iVar23 = iVar11;
      if (iVar10 - iVar9 != 0 && iVar9 <= iVar10) {
        fVar1 = *pfVar16;
        iVar23 = iVar10 - iVar9;
        lVar21 = 0;
        do {
          pfVar15[iVar11 + lVar21] = fVar1 * pfVar25[iVar11 + lVar21];
          pfVar15[(long)iVar11 + lVar21 + 1] = fVar1 * pfVar25[(long)iVar11 + lVar21 + 1];
          pfVar15[(long)iVar11 + lVar21 + 2] = fVar1 * pfVar25[(long)iVar11 + lVar21 + 2];
          pfVar15[(long)iVar11 + lVar21 + 3] = fVar1 * pfVar25[(long)iVar11 + lVar21 + 3];
          lVar21 = lVar21 + 4;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        iVar23 = iVar11 + (int)lVar21;
      }
      if (1 < (int)uVar6) {
        pfVar17 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
        uVar24 = 1;
        do {
          iVar23 = iVar23 + ((iVar9 - iVar10) + iVar7) * 4;
          if (iVar9 < iVar10) {
            fVar1 = pfVar16[uVar24];
            lVar21 = 0;
            iVar19 = iVar10 - iVar9;
            do {
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)pfVar25[iVar23 + lVar21]),ZEXT416((uint)fVar1)
                                        ,ZEXT416((uint)pfVar17[iVar11 + lVar21]));
              pfVar17[iVar11 + lVar21] = auVar28._0_4_;
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)pfVar25[(long)iVar23 + lVar21 + 1]),
                                        ZEXT416((uint)fVar1),
                                        ZEXT416((uint)pfVar17[(long)iVar11 + lVar21 + 1]));
              pfVar17[(long)iVar11 + lVar21 + 1] = auVar28._0_4_;
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)pfVar25[(long)iVar23 + lVar21 + 2]),
                                        ZEXT416((uint)fVar1),
                                        ZEXT416((uint)pfVar17[(long)iVar11 + lVar21 + 2]));
              pfVar17[(long)iVar11 + lVar21 + 2] = auVar28._0_4_;
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)pfVar25[(long)iVar23 + lVar21 + 3]),
                                        ZEXT416((uint)fVar1),
                                        ZEXT416((uint)pfVar17[(long)iVar11 + lVar21 + 3]));
              pfVar17[(long)iVar11 + lVar21 + 3] = auVar28._0_4_;
              lVar21 = lVar21 + 4;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
            iVar23 = iVar23 + (int)lVar21;
          }
          iVar23 = iVar23 + iVar8 * 4;
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar6);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)partitionCount);
  }
  if (0 < partitionCount) {
    pfVar15 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    uVar20 = 0;
    do {
      piVar12 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
      iVar7 = piVar12[partitionIndices[uVar20]];
      lVar22 = (long)iVar7;
      iVar8 = piVar12[(long)partitionIndices[uVar20] + 1];
      lVar21 = (long)iVar8;
      iVar11 = cumulativeScaleIndices[uVar20];
      if (iVar7 < iVar8) {
        pfVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies
                  [stateFrequenciesIndices[uVar20]];
        fVar1 = *pfVar25;
        fVar2 = pfVar25[1];
        fVar3 = pfVar25[2];
        fVar4 = pfVar25[3];
        pfVar25 = pfVar15 + (long)(iVar7 * 4) + 3;
        lVar26 = lVar22;
        do {
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * pfVar25[-2])),ZEXT416((uint)fVar1),
                                    ZEXT416((uint)pfVar25[-3]));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar3),ZEXT416((uint)pfVar25[-1]));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar4),ZEXT416((uint)*pfVar25));
          dVar27 = log((double)auVar28._0_4_);
          (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar26] = (float)dVar27;
          lVar26 = lVar26 + 1;
          pfVar25 = pfVar25 + 4;
        } while (lVar21 != lVar26);
      }
      if ((iVar11 != -1) && (iVar7 < iVar8)) {
        pfVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[iVar11];
        pfVar16 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
        lVar26 = lVar22;
        do {
          pfVar16[lVar26] = pfVar25[lVar26] + pfVar16[lVar26];
          lVar26 = lVar26 + 1;
        } while (lVar21 != lVar26);
      }
      outSumLogLikelihoodByPartition[uVar20] = 0.0;
      if (iVar7 < iVar8) {
        pdVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
        pfVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
        auVar28 = ZEXT816(0) << 0x40;
        do {
          auVar29._0_8_ = (double)pfVar25[lVar22];
          auVar29._8_8_ = in_XMM2_Qb;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pdVar18[lVar22];
          auVar28 = vfmadd231sd_fma(auVar28,auVar29,auVar5);
          outSumLogLikelihoodByPartition[uVar20] = auVar28._0_8_;
          lVar22 = lVar22 + 1;
        } while (lVar21 != lVar22);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}